

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::base::PeriodicTask::Start(PeriodicTask *this,Args *args)

{
  uint uVar1;
  TaskRunner *pTVar2;
  int iVar3;
  uint uVar4;
  TimeNanos TVar5;
  ScopedPlatformHandle r;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_74;
  ScopedPlatformHandle tfd;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  _Bind<void_(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int)>
  local_60;
  _Function_base local_40;
  
  Reset(this);
  if ((args->period_ms != 0) && ((args->task).super__Function_base._M_manager != (_Manager_type)0x0)
     ) {
    Args::operator=(&this->args_,args);
    if ((this->args_).use_suspend_aware_timer == true) {
      uVar1 = (this->args_).period_ms;
      iVar3 = timerfd_create(7,0x80800);
      tfd.t_ = iVar3;
      TVar5 = GetBootTimeNs();
      uVar4 = uVar1 - (int)(TVar5.__r % (long)(ulong)uVar1);
      local_60._M_bound_args.
      super__Tuple_impl<0UL,_perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int>.
      super__Head_base<0UL,_perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_false>.
      _M_head_impl.handle_.
      super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((ulong)uVar4 / 1000);
      local_60._M_bound_args.
      super__Tuple_impl<0UL,_perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int>.
      super__Head_base<0UL,_perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_false>.
      _M_head_impl.handle_.
      super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)((uVar4 % 1000) * 1000000 + 1);
      local_60._M_f = (_func_void_WeakPtr<perfetto::base::PeriodicTask>_uint *)((ulong)uVar1 / 1000)
      ;
      local_60._M_bound_args.
      super__Tuple_impl<0UL,_perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int>.
      _0_8_ = ZEXT48((uVar1 % 1000) * 1000000);
      iVar3 = timerfd_settime(iVar3,0,(itimerspec *)&local_60,(itimerspec *)0x0);
      r = tfd;
      if (iVar3 < 0) {
        r.t_ = -1;
      }
      else {
        tfd.t_ = -1;
      }
      local_74.t_ = r.t_;
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::~ScopedResource(&tfd);
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::reset(&this->timer_fd_,r.t_);
      local_74.t_ = -1;
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::~ScopedResource(&local_74);
      if ((this->timer_fd_).t_ != -1) {
        std::__shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2> *)&tfd,
                   (__shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->weak_ptr_factory_);
        pTVar2 = this->task_runner_;
        uVar1 = (this->timer_fd_).t_;
        local_60._M_f = RunTaskAndPostNext;
        std::tuple<perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int>::
        tuple<perfetto::base::WeakPtr<perfetto::base::PeriodicTask>_&,_unsigned_int_&,_true>
                  (&local_60._M_bound_args,(WeakPtr<perfetto::base::PeriodicTask> *)&tfd,
                   &this->generation_);
        ::std::function<void()>::
        function<std::_Bind<void(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,unsigned_int)>,void>
                  ((function<void()> *)&local_40,&local_60);
        (*pTVar2->_vptr_TaskRunner[4])(pTVar2,(ulong)uVar1,&local_40);
        ::std::_Function_base::~_Function_base(&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_60._M_bound_args.
                    super__Tuple_impl<0UL,_perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int>
                    .
                    super__Head_base<0UL,_perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_false>
                    ._M_head_impl.handle_.
                    super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
      }
    }
    if ((this->timer_fd_).t_ == -1) {
      PostNextTask(this);
    }
    if ((this->args_).start_first_task_immediately == true) {
      std::function<void_()>::operator()(&(this->args_).task);
    }
  }
  return;
}

Assistant:

void PeriodicTask::Start(Args args) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  Reset();
  if (args.period_ms == 0 || !args.task) {
    PERFETTO_DCHECK(args.period_ms > 0);
    PERFETTO_DCHECK(args.task);
    return;
  }
  args_ = std::move(args);
  if (args_.use_suspend_aware_timer) {
    timer_fd_ = CreateTimerFd(args_.period_ms);
    if (timer_fd_) {
      auto weak_this = weak_ptr_factory_.GetWeakPtr();
      task_runner_->AddFileDescriptorWatch(
          *timer_fd_,
          std::bind(PeriodicTask::RunTaskAndPostNext, weak_this, generation_));
    } else {
      PERFETTO_DPLOG("timerfd not supported, falling back on PostDelayedTask");
    }
  }  // if (use_suspend_aware_timer).

  if (!timer_fd_)
    PostNextTask();

  if (args_.start_first_task_immediately)
    args_.task();
}